

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_create_from_ctor(JSContext *ctx,JSValue ctor,int class_id)

{
  int iVar1;
  int64_t iVar2;
  JSValue proto_val;
  JSValue *pJVar3;
  JSValueUnion JVar4;
  JSContext *pJVar5;
  ulong uVar6;
  uint uVar7;
  JSRefCountHeader *p;
  JSValue JVar8;
  JSValue JVar9;
  
  if ((int)ctor.tag == 3) {
    pJVar3 = ctx->class_proto;
LAB_0013940d:
    JVar4 = (JSValueUnion)pJVar3[class_id].u.ptr;
    iVar2 = pJVar3[class_id].tag;
    proto_val.tag = iVar2;
    proto_val.u.ptr = JVar4.ptr;
    if (0xfffffff4 < (uint)iVar2) {
      *(int *)JVar4.ptr = *JVar4.ptr + 1;
      goto LAB_00139474;
    }
    JVar8.tag = iVar2;
    JVar8.u.ptr = JVar4.ptr;
    JVar8 = JS_NewObjectProtoClass(ctx,JVar8,class_id);
  }
  else {
    JVar8 = JS_GetPropertyInternal(ctx,ctor,0x3b,ctor,0);
    JVar4 = JVar8.u;
    uVar7 = (uint)JVar8.tag;
    proto_val = JVar8;
    if (uVar7 != 0xffffffff) {
      if (uVar7 == 6) {
        uVar6 = (ulong)JVar4.ptr & 0xffffffff00000000;
        goto LAB_001394d2;
      }
      if ((0xfffffff4 < uVar7) && (iVar1 = *JVar4.ptr, *(int *)JVar4.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar8);
      }
      pJVar5 = JS_GetFunctionRealm(ctx,ctor);
      if (pJVar5 == (JSContext *)0x0) {
        JVar8 = (JSValue)(ZEXT816(6) << 0x40);
        uVar6 = 0;
        goto LAB_001394d2;
      }
      pJVar3 = pJVar5->class_proto;
      goto LAB_0013940d;
    }
LAB_00139474:
    JVar8 = JS_NewObjectProtoClass(ctx,proto_val,class_id);
    iVar1 = *proto_val.u.ptr;
    *(int *)proto_val.u.ptr = iVar1 + -1;
    if (iVar1 < 2) {
      __JS_FreeValueRT(ctx->rt,proto_val);
    }
  }
  uVar6 = (ulong)JVar8.u.ptr & 0xffffffff00000000;
LAB_001394d2:
  JVar9.u.ptr = (void *)((ulong)JVar8.u.ptr & 0xffffffff | uVar6);
  JVar9.tag = JVar8.tag;
  return JVar9;
}

Assistant:

static JSValue js_create_from_ctor(JSContext *ctx, JSValueConst ctor,
                                   int class_id)
{
    JSValue proto, obj;
    JSContext *realm;
    
    if (JS_IsUndefined(ctor)) {
        proto = JS_DupValue(ctx, ctx->class_proto[class_id]);
    } else {
        proto = JS_GetProperty(ctx, ctor, JS_ATOM_prototype);
        if (JS_IsException(proto))
            return proto;
        if (!JS_IsObject(proto)) {
            JS_FreeValue(ctx, proto);
            realm = JS_GetFunctionRealm(ctx, ctor);
            if (!realm)
                return JS_EXCEPTION;
            proto = JS_DupValue(ctx, realm->class_proto[class_id]);
        }
    }
    obj = JS_NewObjectProtoClass(ctx, proto, class_id);
    JS_FreeValue(ctx, proto);
    return obj;
}